

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O2

void dxil_spv::build_exploded_composite_from_vector(Impl *impl,Instruction *value,uint active_lanes)

{
  uint uVar1;
  Id IVar2;
  Id type_id;
  iterator iVar3;
  Type *pTVar4;
  Operation *pOVar5;
  key_type *ppVVar6;
  ulong uVar7;
  key_type *__k;
  Id extracted [4];
  
  __k = (key_type *)extracted;
  extracted._0_8_ = value;
  iVar3 = std::
          _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->llvm_composite_meta)._M_h,__k);
  if ((iVar3.
       super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(char *)((long)iVar3.
                      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_false>
                      ._M_cur + 0x19) == '\x01')) {
    pTVar4 = LLVMBC::Value::getType(&value->super_Value);
    uVar1 = LLVMBC::Type::getStructNumElements(pTVar4);
    uVar7 = 0;
    IVar2 = Converter::Impl::get_id_for_value(impl,&value->super_Value,0);
    extracted[0] = 0;
    extracted[1] = 0;
    extracted[2] = 0;
    extracted[3] = 0;
    while( true ) {
      pTVar4 = LLVMBC::Value::getType(&value->super_Value);
      if (active_lanes == uVar7) break;
      pTVar4 = LLVMBC::Type::getStructElementType(pTVar4,(uint)uVar7);
      type_id = Converter::Impl::get_type_id(impl,pTVar4,0);
      pOVar5 = Converter::Impl::allocate(impl,OpCompositeExtract,type_id);
      Operation::add_id(pOVar5,IVar2);
      Operation::add_literal(pOVar5,(uint)uVar7);
      Converter::Impl::add(impl,pOVar5,false);
      extracted[uVar7] = pOVar5->id;
      uVar7 = uVar7 + 1;
    }
    IVar2 = Converter::Impl::get_type_id(impl,pTVar4,0);
    pOVar5 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar2);
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      ppVVar6 = (key_type *)(extracted + (active_lanes - 1));
      if (uVar7 < active_lanes) {
        ppVVar6 = __k;
      }
      Operation::add_id(pOVar5,*(Id *)ppVVar6);
      __k = (key_type *)((long)__k + 4);
    }
    Converter::Impl::add(impl,pOVar5,false);
    Converter::Impl::rewrite_value(impl,&value->super_Value,pOVar5->id);
  }
  return;
}

Assistant:

void build_exploded_composite_from_vector(Converter::Impl &impl, const llvm::Instruction *value, unsigned active_lanes)
{
	auto itr = impl.llvm_composite_meta.find(value);
	if (itr == impl.llvm_composite_meta.end())
		return;

	auto &m = *itr;
	if (m.second.forced_struct)
	{
		// This value will be consumed by something other than plain OpCompositeExtract, force output struct type.
		unsigned elems = value->getType()->getStructNumElements();
		spv::Id id = impl.get_id_for_value(value);

		spv::Id extracted[4] = {};
		for (unsigned i = 0; i < active_lanes; i++)
		{
			auto *ext = impl.allocate(spv::OpCompositeExtract, impl.get_type_id(value->getType()->getStructElementType(i)));
			ext->add_id(id);
			ext->add_literal(i);
			impl.add(ext);
			extracted[i] = ext->id;
		}

		auto *struct_op = impl.allocate(spv::OpCompositeConstruct, impl.get_type_id(value->getType()));
		for (unsigned i = 0; i < elems; i++)
		{
			if (i < active_lanes)
				struct_op->add_id(extracted[i]);
			else
				struct_op->add_id(extracted[active_lanes - 1]);
		}

		impl.add(struct_op);
		impl.rewrite_value(value, struct_op->id);
	}
}